

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O3

void vk::validateAllocationCallbacks
               (AllocationCallbackRecorder *recorder,AllocationCallbackValidationResults *results)

{
  pointer *ppAVar1;
  void **ppvVar2;
  pointer *ppAVar3;
  AllocationCallbackRecord *pAVar4;
  size_t *psVar5;
  VkSystemAllocationScope VVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  void *pvVar10;
  mapped_type_conflict1 mVar11;
  iterator __position;
  size_t sVar12;
  size_t sVar13;
  pointer __args;
  undefined4 uVar14;
  pointer pAVar15;
  _Base_ptr p_Var16;
  Type TVar17;
  long lVar18;
  mapped_type_conflict1 *pmVar19;
  size_t sVar20;
  VkSystemAllocationScope *pVVar21;
  pointer pAVar22;
  _Base_ptr p_Var23;
  ulong uVar24;
  iterator iVar25;
  _Base_ptr p_Var26;
  _Base_ptr p_Var27;
  _Rb_tree_header *p_Var28;
  Block *pBVar29;
  bool bVar30;
  vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  allocations;
  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ptrToSlotIndex;
  value_type local_d8;
  vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
  *local_a0;
  vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  local_98;
  pointer local_78;
  _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  local_70;
  Block *local_40;
  ulong local_38;
  
  local_98.
  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38 = (recorder->m_records).m_blockSize;
  pBVar29 = (recorder->m_records).m_first;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((pBVar29 == (recorder->m_records).m_last) &&
     ((recorder->m_records).m_numElements % local_38 == 0)) {
    std::
    _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
    ::~_Rb_tree(&local_70);
  }
  else {
    local_a0 = &results->violations;
    uVar24 = 0;
    do {
      p_Var28 = &local_70._M_impl.super__Rb_tree_header;
      pAVar4 = pBVar29->elements + uVar24;
      TVar17 = pBVar29->elements[uVar24].type;
      local_40 = pBVar29;
      if (TVar17 == TYPE_INTERNAL_ALLOCATION) {
LAB_009e8ce6:
        pVVar21 = &(pAVar4->data).internalAllocation.scope;
LAB_009e8cea:
        if (VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE < *pVVar21) {
          local_d8.record.type = pAVar4->type;
          local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
          local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
          local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
          local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
          local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
          local_d8.record.data.reallocation.returnedPtr = (pAVar4->data).reallocation.returnedPtr;
          local_d8.isLive = true;
          local_d8._49_3_ = 0;
          iVar25._M_current =
               (results->violations).
               super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar25._M_current ==
              (results->violations).
              super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
            ::_M_realloc_insert<vk::AllocationCallbackViolation>
                      (local_a0,iVar25,(AllocationCallbackViolation *)&local_d8);
          }
          else {
            *(ulong *)&(iVar25._M_current)->reason = CONCAT44(local_d8._52_4_,5);
            ((iVar25._M_current)->record).data.allocation.returnedPtr =
                 local_d8.record.data.allocation.returnedPtr;
            ((iVar25._M_current)->record).data.reallocation.returnedPtr =
                 local_d8.record.data.reallocation.returnedPtr;
            ((iVar25._M_current)->record).data.allocation.alignment =
                 local_d8.record.data.allocation.alignment;
            ((iVar25._M_current)->record).data.reallocation.alignment =
                 local_d8.record.data.reallocation.alignment;
            ((iVar25._M_current)->record).type = local_d8.record.type;
            *(undefined4 *)&((iVar25._M_current)->record).field_0x4 = local_d8.record._4_4_;
            ((iVar25._M_current)->record).data.allocation.size =
                 local_d8.record.data.allocation.size;
            ppAVar1 = &(results->violations).
                       super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
          TVar17 = pAVar4->type;
        }
        if ((TVar17 < TYPE_FREE) &&
           (uVar7 = *(ulong *)((long)&pAVar4->data + (ulong)(TVar17 != TYPE_ALLOCATION) * 8 + 8),
           (uVar7 & uVar7 - 1) != 0)) {
          local_d8.record.type = pAVar4->type;
          local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
          local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
          local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
          local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
          local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
          local_d8.record.data.reallocation.returnedPtr = (pAVar4->data).reallocation.returnedPtr;
          local_d8.isLive = true;
          local_d8._49_3_ = 0;
          iVar25._M_current =
               (results->violations).
               super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar25._M_current ==
              (results->violations).
              super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
            ::_M_realloc_insert<vk::AllocationCallbackViolation>
                      (local_a0,iVar25,(AllocationCallbackViolation *)&local_d8);
          }
          else {
            *(ulong *)&(iVar25._M_current)->reason = CONCAT44(local_d8._52_4_,7);
            ((iVar25._M_current)->record).data.allocation.returnedPtr =
                 local_d8.record.data.allocation.returnedPtr;
            ((iVar25._M_current)->record).data.reallocation.returnedPtr =
                 local_d8.record.data.reallocation.returnedPtr;
            ((iVar25._M_current)->record).data.allocation.alignment =
                 local_d8.record.data.allocation.alignment;
            ((iVar25._M_current)->record).data.reallocation.alignment =
                 local_d8.record.data.reallocation.alignment;
            ((iVar25._M_current)->record).type = local_d8.record.type;
            *(undefined4 *)&((iVar25._M_current)->record).field_0x4 = local_d8.record._4_4_;
            ((iVar25._M_current)->record).data.allocation.size =
                 local_d8.record.data.allocation.size;
            ppAVar1 = &(results->violations).
                       super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
          TVar17 = pAVar4->type;
        }
      }
      else {
        if (TVar17 == TYPE_REALLOCATION) {
          pVVar21 = &(pAVar4->data).reallocation.scope;
          goto LAB_009e8cea;
        }
        if (TVar17 == TYPE_ALLOCATION) {
          pVVar21 = &(pAVar4->data).allocation.scope;
          goto LAB_009e8cea;
        }
        if (TVar17 == TYPE_INTERNAL_FREE) goto LAB_009e8ce6;
      }
      pAVar15 = local_98.
                super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pAVar22 = local_98.
                super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                ._M_impl.super__Vector_impl_data._M_start;
      switch(TVar17) {
      case TYPE_ALLOCATION:
        pvVar9 = (pAVar4->data).allocation.returnedPtr;
        if (pvVar9 != (void *)0x0) {
          ppvVar2 = &(pAVar4->data).allocation.returnedPtr;
          p_Var16 = local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var27 = &p_Var28->_M_header;
          if (local_70._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            do {
              p_Var26 = p_Var27;
              p_Var23 = p_Var16;
              pvVar10 = *(void **)(p_Var23 + 1);
              p_Var27 = p_Var23;
              if (pvVar10 < pvVar9) {
                p_Var27 = p_Var26;
              }
              p_Var16 = (&p_Var23->_M_left)[pvVar10 < pvVar9];
            } while ((&p_Var23->_M_left)[pvVar10 < pvVar9] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var27 != p_Var28) {
              if (pvVar10 < pvVar9) {
                p_Var23 = p_Var26;
              }
              if (*(void **)(p_Var23 + 1) <= pvVar9) {
                pmVar19 = std::
                          map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                          ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                        *)&local_70,ppvVar2);
                mVar11 = *pmVar19;
                pAVar22 = local_98.
                          super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (local_98.
                    super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                    ._M_impl.super__Vector_impl_data._M_start[mVar11].isLive != false) break;
LAB_009e9297:
                pAVar22 = pAVar22 + mVar11;
                pAVar22->isLive = true;
                uVar14 = *(undefined4 *)&pAVar4->field_0x4;
                sVar20 = (pAVar4->data).allocation.size;
                sVar12 = (pAVar4->data).allocation.alignment;
                sVar13 = (pAVar4->data).reallocation.alignment;
                pvVar9 = (pAVar4->data).allocation.returnedPtr;
                pvVar10 = (pAVar4->data).reallocation.returnedPtr;
                (pAVar22->record).type = pAVar4->type;
                *(undefined4 *)&(pAVar22->record).field_0x4 = uVar14;
                (pAVar22->record).data.allocation.size = sVar20;
                (pAVar22->record).data.allocation.alignment = sVar12;
                (pAVar22->record).data.reallocation.alignment = sVar13;
                (pAVar22->record).data.allocation.returnedPtr = pvVar9;
                (pAVar22->record).data.reallocation.returnedPtr = pvVar10;
                break;
              }
            }
          }
          pmVar19 = std::
                    map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                    ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                  *)&local_70,ppvVar2);
          *pmVar19 = ((long)pAVar15 - (long)pAVar22 >> 3) * 0x6db6db6db6db6db7;
          local_d8.record.type = pAVar4->type;
          local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
          local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
          local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
          local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
          local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
          local_d8.record.data.reallocation.returnedPtr = (pAVar4->data).reallocation.returnedPtr;
          local_d8.isLive = true;
          std::
          vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
          ::push_back(&local_98,&local_d8);
        }
        break;
      case TYPE_REALLOCATION:
        uVar7 = (pAVar4->data).allocation.size;
        if (local_70._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var16 = local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var27 = &p_Var28->_M_header;
          do {
            p_Var26 = p_Var27;
            p_Var23 = p_Var16;
            uVar8 = *(ulong *)(p_Var23 + 1);
            p_Var27 = p_Var23;
            if (uVar8 < uVar7) {
              p_Var27 = p_Var26;
            }
            p_Var16 = (&p_Var23->_M_left)[uVar8 < uVar7];
          } while ((&p_Var23->_M_left)[uVar8 < uVar7] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var27 != p_Var28) {
            if (uVar8 < uVar7) {
              p_Var23 = p_Var26;
            }
            if (*(ulong *)(p_Var23 + 1) <= uVar7) {
              pmVar19 = std::
                        map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                        ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                      *)&local_70,&(pAVar4->data).free.mem);
              pAVar22 = local_98.
                        super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                        ._M_impl.super__Vector_impl_data._M_start + *pmVar19;
              if ((pAVar4->data).allocation.alignment == 0) {
                pAVar22->isLive = false;
                break;
              }
              local_78 = local_98.
                         super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              TVar17 = (pAVar22->record).type;
              if (TVar17 == TYPE_ALLOCATION) {
                lVar18 = 0x10;
LAB_009e9363:
                sVar20 = *(size_t *)((long)&(pAVar22->record).type + lVar18);
              }
              else {
                if (TVar17 == TYPE_REALLOCATION) {
                  lVar18 = 0x18;
                  goto LAB_009e9363;
                }
                sVar20 = 0;
              }
              if (sVar20 != (pAVar4->data).reallocation.alignment) {
                local_d8.record.type = pAVar4->type;
                local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
                local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
                local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
                local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
                local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
                local_d8.record.data.reallocation.returnedPtr =
                     (pAVar4->data).reallocation.returnedPtr;
                local_d8.isLive = true;
                local_d8._49_3_ = 0;
                iVar25._M_current =
                     (results->violations).
                     super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar25._M_current ==
                    (results->violations).
                    super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                  ::_M_realloc_insert<vk::AllocationCallbackViolation>
                            (local_a0,iVar25,(AllocationCallbackViolation *)&local_d8);
                }
                else {
                  *(ulong *)&(iVar25._M_current)->reason = CONCAT44(local_d8._52_4_,8);
                  ((iVar25._M_current)->record).data.allocation.returnedPtr =
                       local_d8.record.data.allocation.returnedPtr;
                  ((iVar25._M_current)->record).data.reallocation.returnedPtr =
                       local_d8.record.data.reallocation.returnedPtr;
                  ((iVar25._M_current)->record).data.allocation.alignment =
                       local_d8.record.data.allocation.alignment;
                  ((iVar25._M_current)->record).data.reallocation.alignment =
                       local_d8.record.data.reallocation.alignment;
                  ((iVar25._M_current)->record).type = local_d8.record.type;
                  *(undefined4 *)&((iVar25._M_current)->record).field_0x4 = local_d8.record._4_4_;
                  ((iVar25._M_current)->record).data.allocation.size =
                       local_d8.record.data.allocation.size;
                  ppAVar1 = &(results->violations).
                             super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppAVar1 = *ppAVar1 + 1;
                }
              }
              pAVar15 = local_98.
                        super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pvVar9 = (pAVar4->data).reallocation.returnedPtr;
              if ((void *)(pAVar4->data).allocation.size == pvVar9) {
                if (pAVar22->isLive == false) {
                  local_d8.record.type = pAVar4->type;
                  local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
                  local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
                  local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
                  local_d8.record.data.reallocation.alignment =
                       (pAVar4->data).reallocation.alignment;
                  local_d8.record.data.allocation.returnedPtr =
                       (pAVar4->data).allocation.returnedPtr;
                  local_d8.record.data.reallocation.returnedPtr =
                       (pAVar4->data).reallocation.returnedPtr;
                  local_d8.isLive = true;
                  local_d8._49_3_ = 0;
                  iVar25._M_current =
                       (results->violations).
                       super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar25._M_current ==
                      (results->violations).
                      super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                    ::_M_realloc_insert<vk::AllocationCallbackViolation>
                              (local_a0,iVar25,(AllocationCallbackViolation *)&local_d8);
                  }
                  else {
                    *(ulong *)&(iVar25._M_current)->reason = CONCAT44(local_d8._52_4_,3);
                    ((iVar25._M_current)->record).data.allocation.returnedPtr =
                         local_d8.record.data.allocation.returnedPtr;
                    ((iVar25._M_current)->record).data.reallocation.returnedPtr =
                         local_d8.record.data.reallocation.returnedPtr;
                    ((iVar25._M_current)->record).data.allocation.alignment =
                         local_d8.record.data.allocation.alignment;
                    ((iVar25._M_current)->record).data.reallocation.alignment =
                         local_d8.record.data.reallocation.alignment;
                    ((iVar25._M_current)->record).type = local_d8.record.type;
                    *(undefined4 *)&((iVar25._M_current)->record).field_0x4 = local_d8.record._4_4_;
                    ((iVar25._M_current)->record).data.allocation.size =
                         local_d8.record.data.allocation.size;
                    ppAVar1 = &(results->violations).
                               super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppAVar1 = *ppAVar1 + 1;
                  }
                  pAVar22->isLive = true;
                }
                TVar17 = pAVar4->type;
                uVar14 = *(undefined4 *)&pAVar4->field_0x4;
                sVar20 = (pAVar4->data).allocation.size;
                sVar12 = (pAVar4->data).allocation.alignment;
                sVar13 = (pAVar4->data).reallocation.alignment;
                pvVar9 = (pAVar4->data).reallocation.returnedPtr;
                (pAVar22->record).data.allocation.returnedPtr =
                     (pAVar4->data).allocation.returnedPtr;
                (pAVar22->record).data.reallocation.returnedPtr = pvVar9;
                (pAVar22->record).data.allocation.alignment = sVar12;
                (pAVar22->record).data.reallocation.alignment = sVar13;
                (pAVar22->record).type = TVar17;
                *(undefined4 *)&(pAVar22->record).field_0x4 = uVar14;
                (pAVar22->record).data.allocation.size = sVar20;
              }
              else if (pvVar9 != (void *)0x0) {
                ppvVar2 = &(pAVar4->data).reallocation.returnedPtr;
                pAVar22->isLive = false;
                p_Var16 = local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var27 = &p_Var28->_M_header;
                if (local_70._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                  do {
                    p_Var26 = p_Var27;
                    p_Var23 = p_Var16;
                    pvVar10 = *(void **)(p_Var23 + 1);
                    p_Var27 = p_Var23;
                    if (pvVar10 < pvVar9) {
                      p_Var27 = p_Var26;
                    }
                    p_Var16 = (&p_Var23->_M_left)[pvVar10 < pvVar9];
                  } while ((&p_Var23->_M_left)[pvVar10 < pvVar9] != (_Base_ptr)0x0);
                  if ((_Rb_tree_header *)p_Var27 != p_Var28) {
                    if (pvVar10 < pvVar9) {
                      p_Var23 = p_Var26;
                    }
                    if (*(void **)(p_Var23 + 1) <= pvVar9) {
                      pmVar19 = std::
                                map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                              *)&local_70,ppvVar2);
                      mVar11 = *pmVar19;
                      pAVar22 = local_78;
                      if (local_78[mVar11].isLive == false) goto LAB_009e9297;
                      break;
                    }
                  }
                }
                pmVar19 = std::
                          map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                          ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                        *)&local_70,ppvVar2);
                *pmVar19 = ((long)pAVar15 - (long)local_78 >> 3) * 0x6db6db6db6db6db7;
                local_d8.record.type = pAVar4->type;
                local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
                local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
                local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
                local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
                local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
                local_d8.record.data.reallocation.returnedPtr =
                     (pAVar4->data).reallocation.returnedPtr;
                local_d8.isLive = true;
                std::
                vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                ::push_back(&local_98,&local_d8);
              }
              break;
            }
          }
        }
        if (uVar7 != 0) {
          local_d8.record.type = pAVar4->type;
          local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
          local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
          local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
          local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
          local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
          local_d8.record.data.reallocation.returnedPtr = (pAVar4->data).reallocation.returnedPtr;
          local_d8.isLive = true;
          local_d8._49_3_ = 0;
          iVar25._M_current =
               (results->violations).
               super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar25._M_current ==
              (results->violations).
              super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
            ::_M_realloc_insert<vk::AllocationCallbackViolation>
                      (local_a0,iVar25,(AllocationCallbackViolation *)&local_d8);
          }
          else {
            *(ulong *)&(iVar25._M_current)->reason = CONCAT44(local_d8._52_4_,2);
            ((iVar25._M_current)->record).data.allocation.returnedPtr =
                 local_d8.record.data.allocation.returnedPtr;
            ((iVar25._M_current)->record).data.reallocation.returnedPtr =
                 local_d8.record.data.reallocation.returnedPtr;
            ((iVar25._M_current)->record).data.allocation.alignment =
                 local_d8.record.data.allocation.alignment;
            ((iVar25._M_current)->record).data.reallocation.alignment =
                 local_d8.record.data.reallocation.alignment;
            ((iVar25._M_current)->record).type = local_d8.record.type;
            *(undefined4 *)&((iVar25._M_current)->record).field_0x4 = local_d8.record._4_4_;
            ((iVar25._M_current)->record).data.allocation.size =
                 local_d8.record.data.allocation.size;
            ppAVar1 = &(results->violations).
                       super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
        }
        pAVar15 = local_98.
                  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pAVar22 = local_98.
                  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar9 = (pAVar4->data).reallocation.returnedPtr;
        if (pvVar9 != (void *)0x0) {
          ppvVar2 = &(pAVar4->data).reallocation.returnedPtr;
          p_Var16 = local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var27 = &p_Var28->_M_header;
          if (local_70._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            do {
              p_Var26 = p_Var27;
              p_Var23 = p_Var16;
              pvVar10 = *(void **)(p_Var23 + 1);
              p_Var27 = p_Var23;
              if (pvVar10 < pvVar9) {
                p_Var27 = p_Var26;
              }
              p_Var16 = (&p_Var23->_M_left)[pvVar10 < pvVar9];
            } while ((&p_Var23->_M_left)[pvVar10 < pvVar9] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var27 != p_Var28) {
              if (pvVar10 < pvVar9) {
                p_Var23 = p_Var26;
              }
              if (*(void **)(p_Var23 + 1) <= pvVar9) {
                pmVar19 = std::
                          map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                          ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                        *)&local_70,ppvVar2);
                mVar11 = *pmVar19;
                local_98.
                super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                ._M_impl.super__Vector_impl_data._M_start[mVar11].isLive = true;
                uVar14 = *(undefined4 *)&pAVar4->field_0x4;
                sVar20 = (pAVar4->data).allocation.size;
                sVar12 = (pAVar4->data).allocation.alignment;
                sVar13 = (pAVar4->data).reallocation.alignment;
                pvVar9 = (pAVar4->data).allocation.returnedPtr;
                pvVar10 = (pAVar4->data).reallocation.returnedPtr;
                pAVar22 = local_98.
                          super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                          ._M_impl.super__Vector_impl_data._M_start + mVar11;
                (pAVar22->record).type = pAVar4->type;
                *(undefined4 *)&(pAVar22->record).field_0x4 = uVar14;
                (pAVar22->record).data.allocation.size = sVar20;
                psVar5 = &local_98.
                          super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                          ._M_impl.super__Vector_impl_data._M_start[mVar11].record.data.allocation.
                          alignment;
                *psVar5 = sVar12;
                psVar5[1] = sVar13;
                ppvVar2 = &local_98.
                           super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                           ._M_impl.super__Vector_impl_data._M_start[mVar11].record.data.allocation.
                           returnedPtr;
                *ppvVar2 = pvVar9;
                ppvVar2[1] = pvVar10;
                break;
              }
            }
          }
          pmVar19 = std::
                    map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                    ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                  *)&local_70,ppvVar2);
          *pmVar19 = ((long)pAVar15 - (long)pAVar22 >> 3) * 0x6db6db6db6db6db7;
          local_d8.record.type = pAVar4->type;
          local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
          local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
          local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
          local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
          local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
          local_d8.record.data.reallocation.returnedPtr = (pAVar4->data).reallocation.returnedPtr;
          local_d8.isLive = true;
          std::
          vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
          ::push_back(&local_98,&local_d8);
        }
        break;
      case TYPE_FREE:
        uVar7 = (pAVar4->data).allocation.size;
        if (uVar7 != 0) {
          if (local_70._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            p_Var16 = local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var27 = &p_Var28->_M_header;
            do {
              p_Var26 = p_Var27;
              p_Var23 = p_Var16;
              uVar8 = *(ulong *)(p_Var23 + 1);
              p_Var27 = p_Var23;
              if (uVar8 < uVar7) {
                p_Var27 = p_Var26;
              }
              p_Var16 = (&p_Var23->_M_left)[uVar8 < uVar7];
            } while ((&p_Var23->_M_left)[uVar8 < uVar7] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var27 != p_Var28) {
              if (uVar8 < uVar7) {
                p_Var23 = p_Var26;
              }
              if (*(ulong *)(p_Var23 + 1) <= uVar7) {
                pmVar19 = std::
                          map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                          ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                        *)&local_70,&(pAVar4->data).free.mem);
                if (local_98.
                    super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                    ._M_impl.super__Vector_impl_data._M_start[*pmVar19].isLive == true) {
                  local_98.
                  super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                  ._M_impl.super__Vector_impl_data._M_start[*pmVar19].isLive = false;
                }
                else {
                  local_d8.record.type = pAVar4->type;
                  local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
                  local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
                  local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
                  local_d8.record.data.reallocation.alignment =
                       (pAVar4->data).reallocation.alignment;
                  local_d8.record.data.allocation.returnedPtr =
                       (pAVar4->data).allocation.returnedPtr;
                  local_d8.record.data.reallocation.returnedPtr =
                       (pAVar4->data).reallocation.returnedPtr;
                  local_d8.isLive = false;
                  local_d8._49_3_ = 0;
                  iVar25._M_current =
                       (results->violations).
                       super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar25._M_current !=
                      (results->violations).
                      super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_009e8ecc;
                  std::
                  vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                  ::_M_realloc_insert<vk::AllocationCallbackViolation>
                            (local_a0,iVar25,(AllocationCallbackViolation *)&local_d8);
                }
                break;
              }
            }
          }
          local_d8.record.type = pAVar4->type;
          local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
          local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
          local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
          local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
          local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
          local_d8.record.data.reallocation.returnedPtr = (pAVar4->data).reallocation.returnedPtr;
          local_d8.isLive = true;
          local_d8._49_3_ = 0;
          iVar25._M_current =
               (results->violations).
               super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar25._M_current ==
              (results->violations).
              super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
            ::_M_realloc_insert<vk::AllocationCallbackViolation>
                      (local_a0,iVar25,(AllocationCallbackViolation *)&local_d8);
          }
          else {
LAB_009e8ecc:
            *(ulong *)&(iVar25._M_current)->reason = CONCAT44(local_d8._52_4_,local_d8._48_4_);
            ((iVar25._M_current)->record).data.allocation.returnedPtr =
                 local_d8.record.data.allocation.returnedPtr;
            ((iVar25._M_current)->record).data.reallocation.returnedPtr =
                 local_d8.record.data.reallocation.returnedPtr;
            ((iVar25._M_current)->record).data.allocation.alignment =
                 local_d8.record.data.allocation.alignment;
            ((iVar25._M_current)->record).data.reallocation.alignment =
                 local_d8.record.data.reallocation.alignment;
            ((iVar25._M_current)->record).type = local_d8.record.type;
            *(undefined4 *)&((iVar25._M_current)->record).field_0x4 = local_d8.record._4_4_;
            ((iVar25._M_current)->record).data.allocation.size =
                 local_d8.record.data.allocation.size;
            ppAVar1 = &(results->violations).
                       super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
        }
        break;
      case TYPE_INTERNAL_ALLOCATION:
      case TYPE_INTERNAL_FREE:
        if ((pAVar4->data).internalAllocation.type == VK_INTERNAL_ALLOCATION_TYPE_EXECUTABLE) {
          VVar6 = (pAVar4->data).internalAllocation.scope;
          uVar7 = (pAVar4->data).allocation.size;
          uVar8 = results->internalAllocationTotal[0][VVar6];
          if ((TVar17 == TYPE_INTERNAL_FREE) && (bVar30 = uVar8 < uVar7, uVar7 = -uVar7, bVar30)) {
            local_d8.record.type = pAVar4->type;
            local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
            local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
            local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
            local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
            local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
            local_d8.record.data.reallocation.returnedPtr = (pAVar4->data).reallocation.returnedPtr;
            local_d8.isLive = true;
            local_d8._49_3_ = 0;
            iVar25._M_current =
                 (results->violations).
                 super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar25._M_current ==
                (results->violations).
                super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
              ::_M_realloc_insert<vk::AllocationCallbackViolation>
                        (local_a0,iVar25,(AllocationCallbackViolation *)&local_d8);
            }
            else {
              *(ulong *)&(iVar25._M_current)->reason = CONCAT44(local_d8._52_4_,4);
              ((iVar25._M_current)->record).data.allocation.returnedPtr =
                   local_d8.record.data.allocation.returnedPtr;
              ((iVar25._M_current)->record).data.reallocation.returnedPtr =
                   local_d8.record.data.reallocation.returnedPtr;
              ((iVar25._M_current)->record).data.allocation.alignment =
                   local_d8.record.data.allocation.alignment;
              ((iVar25._M_current)->record).data.reallocation.alignment =
                   local_d8.record.data.reallocation.alignment;
              ((iVar25._M_current)->record).type = local_d8.record.type;
              *(undefined4 *)&((iVar25._M_current)->record).field_0x4 = local_d8.record._4_4_;
              ((iVar25._M_current)->record).data.allocation.size =
                   local_d8.record.data.allocation.size;
              ppAVar1 = &(results->violations).
                         super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            results->internalAllocationTotal[0][VVar6] = 0;
          }
          else {
            results->internalAllocationTotal[0][VVar6] = uVar8 + uVar7;
          }
        }
        else {
          local_d8.record.type = pAVar4->type;
          local_d8.record._4_4_ = *(undefined4 *)&pAVar4->field_0x4;
          local_d8.record.data.allocation.size = (pAVar4->data).allocation.size;
          local_d8.record.data.allocation.alignment = (pAVar4->data).allocation.alignment;
          local_d8.record.data.reallocation.alignment = (pAVar4->data).reallocation.alignment;
          local_d8.record.data.allocation.returnedPtr = (pAVar4->data).allocation.returnedPtr;
          local_d8.record.data.reallocation.returnedPtr = (pAVar4->data).reallocation.returnedPtr;
          local_d8.isLive = true;
          local_d8._49_3_ = 0;
          iVar25._M_current =
               (results->violations).
               super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar25._M_current !=
              (results->violations).
              super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_009e8ecc;
          std::
          vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
          ::_M_realloc_insert<vk::AllocationCallbackViolation>
                    (local_a0,iVar25,(AllocationCallbackViolation *)&local_d8);
        }
      }
      pAVar15 = local_98.
                super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pAVar22 = local_98.
                super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar24 = uVar24 + 1;
      pBVar29 = local_40;
      if (uVar24 == local_38) {
        uVar24 = 0;
        pBVar29 = local_40->next;
      }
    } while ((pBVar29 != (recorder->m_records).m_last) ||
            (__args = local_98.
                      super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            uVar24 != (recorder->m_records).m_numElements % (recorder->m_records).m_blockSize));
    for (; __args != pAVar15; __args = __args + 1) {
      if (__args->isLive == true) {
        __position._M_current =
             (results->liveAllocations).
             super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (results->liveAllocations).
            super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vk::AllocationCallbackRecord,std::allocator<vk::AllocationCallbackRecord>>::
          _M_realloc_insert<vk::AllocationCallbackRecord_const&>
                    ((vector<vk::AllocationCallbackRecord,std::allocator<vk::AllocationCallbackRecord>>
                      *)results,__position,&__args->record);
        }
        else {
          TVar17 = (__args->record).type;
          uVar14 = *(undefined4 *)&(__args->record).field_0x4;
          sVar20 = (__args->record).data.allocation.size;
          sVar12 = (__args->record).data.allocation.alignment;
          sVar13 = (__args->record).data.reallocation.alignment;
          pvVar9 = (__args->record).data.reallocation.returnedPtr;
          ((__position._M_current)->data).allocation.returnedPtr =
               (__args->record).data.allocation.returnedPtr;
          ((__position._M_current)->data).reallocation.returnedPtr = pvVar9;
          ((__position._M_current)->data).allocation.alignment = sVar12;
          ((__position._M_current)->data).reallocation.alignment = sVar13;
          (__position._M_current)->type = TVar17;
          *(undefined4 *)&(__position._M_current)->field_0x4 = uVar14;
          ((__position._M_current)->data).allocation.size = sVar20;
          ppAVar3 = &(results->liveAllocations).
                     super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar3 = *ppAVar3 + 1;
        }
      }
    }
    std::
    _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
    ::~_Rb_tree(&local_70);
    if (pAVar22 != (pointer)0x0) {
      operator_delete(pAVar22,(long)local_98.
                                    super__Vector_base<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)pAVar22);
    }
  }
  return;
}

Assistant:

void validateAllocationCallbacks (const AllocationCallbackRecorder& recorder, AllocationCallbackValidationResults* results)
{
	std::vector<AllocationSlot>		allocations;
	std::map<void*, size_t>			ptrToSlotIndex;

	DE_ASSERT(results->liveAllocations.empty() && results->violations.empty());

	for (AllocationCallbackRecorder::RecordIterator callbackIter = recorder.getRecordsBegin();
		 callbackIter != recorder.getRecordsEnd();
		 ++callbackIter)
	{
		const AllocationCallbackRecord&		record	= *callbackIter;

		// Validate scope
		{
			const VkSystemAllocationScope* const	scopePtr	= record.type == AllocationCallbackRecord::TYPE_ALLOCATION			? &record.data.allocation.scope
																: record.type == AllocationCallbackRecord::TYPE_REALLOCATION		? &record.data.reallocation.scope
																: record.type == AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION	? &record.data.internalAllocation.scope
																: record.type == AllocationCallbackRecord::TYPE_INTERNAL_FREE		? &record.data.internalAllocation.scope
																: DE_NULL;

			if (scopePtr && !de::inBounds(*scopePtr, (VkSystemAllocationScope)0, VK_SYSTEM_ALLOCATION_SCOPE_LAST))
				results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_INVALID_ALLOCATION_SCOPE));
		}

		// Validate alignment
		if (record.type == AllocationCallbackRecord::TYPE_ALLOCATION ||
			record.type == AllocationCallbackRecord::TYPE_REALLOCATION)
		{
			if (!deIsPowerOfTwoSize(getAlignment(record)))
				results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_INVALID_ALIGNMENT));
		}

		// Validate actual allocation behavior
		switch (record.type)
		{
			case AllocationCallbackRecord::TYPE_ALLOCATION:
			{
				if (record.data.allocation.returnedPtr)
				{
					if (!de::contains(ptrToSlotIndex, record.data.allocation.returnedPtr))
					{
						ptrToSlotIndex[record.data.allocation.returnedPtr] = allocations.size();
						allocations.push_back(AllocationSlot(record, true));
					}
					else
					{
						const size_t		slotNdx		= ptrToSlotIndex[record.data.allocation.returnedPtr];
						if (!allocations[slotNdx].isLive)
						{
							allocations[slotNdx].isLive = true;
							allocations[slotNdx].record = record;
						}
						else
						{
							// we should not have multiple live allocations with the same pointer
							DE_ASSERT(false);
						}
					}
				}

				break;
			}

			case AllocationCallbackRecord::TYPE_REALLOCATION:
			{
				if (de::contains(ptrToSlotIndex, record.data.reallocation.original))
				{
					const size_t		origSlotNdx		= ptrToSlotIndex[record.data.reallocation.original];
					AllocationSlot&		origSlot		= allocations[origSlotNdx];

					DE_ASSERT(record.data.reallocation.original != DE_NULL);

					if (record.data.reallocation.size > 0)
					{
						if (getAlignment(origSlot.record) != record.data.reallocation.alignment)
							results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_REALLOC_DIFFERENT_ALIGNMENT));

						if (record.data.reallocation.original == record.data.reallocation.returnedPtr)
						{
							if (!origSlot.isLive)
							{
								results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_REALLOC_FREED_PTR));
								origSlot.isLive	= true; // Mark live to suppress further errors
							}

							// Just update slot record
							allocations[origSlotNdx].record = record;
						}
						else
						{
							if (record.data.reallocation.returnedPtr)
							{
								allocations[origSlotNdx].isLive = false;
								if (!de::contains(ptrToSlotIndex, record.data.reallocation.returnedPtr))
								{
									ptrToSlotIndex[record.data.reallocation.returnedPtr] = allocations.size();
									allocations.push_back(AllocationSlot(record, true));
								}
								else
								{
									const size_t slotNdx = ptrToSlotIndex[record.data.reallocation.returnedPtr];
									if (!allocations[slotNdx].isLive)
									{
										allocations[slotNdx].isLive = true;
										allocations[slotNdx].record = record;
									}
									else
									{
										// we should not have multiple live allocations with the same pointer
										DE_ASSERT(false);
									}
								}
							}
							// else original ptr remains valid and live
						}
					}
					else
					{
						DE_ASSERT(!record.data.reallocation.returnedPtr);

						origSlot.isLive = false;
					}
				}
				else
				{
					if (record.data.reallocation.original)
						results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_REALLOC_NOT_ALLOCATED_PTR));

					if (record.data.reallocation.returnedPtr)
					{
						if (!de::contains(ptrToSlotIndex, record.data.reallocation.returnedPtr))
						{
							ptrToSlotIndex[record.data.reallocation.returnedPtr] = allocations.size();
							allocations.push_back(AllocationSlot(record, true));
						}
						else
						{
							const size_t slotNdx = ptrToSlotIndex[record.data.reallocation.returnedPtr];
							DE_ASSERT(!allocations[slotNdx].isLive);
							allocations[slotNdx].isLive = true;
							allocations[slotNdx].record = record;
						}
					}
				}

				break;
			}

			case AllocationCallbackRecord::TYPE_FREE:
			{
				if (record.data.free.mem != DE_NULL) // Freeing null pointer is valid and ignored
				{
					if (de::contains(ptrToSlotIndex, record.data.free.mem))
					{
						const size_t	slotNdx		= ptrToSlotIndex[record.data.free.mem];

						if (allocations[slotNdx].isLive)
							allocations[slotNdx].isLive = false;
						else
							results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_DOUBLE_FREE));
					}
					else
						results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_FREE_NOT_ALLOCATED_PTR));
				}

				break;
			}

			case AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION:
			case AllocationCallbackRecord::TYPE_INTERNAL_FREE:
			{
				if (de::inBounds(record.data.internalAllocation.type, (VkInternalAllocationType)0, VK_INTERNAL_ALLOCATION_TYPE_LAST))
				{
					size_t* const		totalAllocSizePtr	= &results->internalAllocationTotal[record.data.internalAllocation.type][record.data.internalAllocation.scope];
					const size_t		size				= record.data.internalAllocation.size;

					if (record.type == AllocationCallbackRecord::TYPE_INTERNAL_FREE)
					{
						if (*totalAllocSizePtr < size)
						{
							results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_NEGATIVE_INTERNAL_ALLOCATION_TOTAL));
							*totalAllocSizePtr = 0; // Reset to 0 to suppress compound errors
						}
						else
							*totalAllocSizePtr -= size;
					}
					else
						*totalAllocSizePtr += size;
				}
				else
					results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_INVALID_INTERNAL_ALLOCATION_TYPE));

				break;
			}

			default:
				DE_ASSERT(false);
		}
	}

	DE_ASSERT(!de::contains(ptrToSlotIndex, DE_NULL));

	// Collect live allocations
	for (std::vector<AllocationSlot>::const_iterator slotIter = allocations.begin();
		 slotIter != allocations.end();
		 ++slotIter)
	{
		if (slotIter->isLive)
			results->liveAllocations.push_back(slotIter->record);
	}
}